

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiStyleMod local_1c;
  
  pIVar2 = GImGui;
  if (GStyleVarInfo[idx].Count == 1) {
    uVar1 = GStyleVarInfo[idx].Offset;
    local_1c.field_1.BackupInt[0] = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar1);
    local_1c.VarIdx = idx;
    ImVector<ImGuiStyleMod>::push_back(&GImGui->StyleVarStack,&local_1c);
    *(float *)((long)&(pIVar2->Style).Alpha + (ulong)uVar1) = val;
  }
  return;
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}